

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh new_object(qpdf_data qpdf,QPDFObjectHandle *qoh)

{
  mapped_type *this;
  QPDFObjectHandle local_30;
  qpdf_oh local_1c;
  QPDFObjectHandle *pQStack_18;
  qpdf_oh oh;
  QPDFObjectHandle *qoh_local;
  qpdf_data qpdf_local;
  
  local_1c = qpdf->next_oh + 1;
  qpdf->next_oh = local_1c;
  pQStack_18 = qoh;
  qoh_local = (QPDFObjectHandle *)qpdf;
  std::make_shared<QPDFObjectHandle,QPDFObjectHandle_const&>(&local_30);
  this = std::
         map<unsigned_int,_std::shared_ptr<QPDFObjectHandle>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>_>
         ::operator[]((map<unsigned_int,_std::shared_ptr<QPDFObjectHandle>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>_>
                       *)&qoh_local[0xb].super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      &local_1c);
  std::shared_ptr<QPDFObjectHandle>::operator=(this,(shared_ptr<QPDFObjectHandle> *)&local_30);
  std::shared_ptr<QPDFObjectHandle>::~shared_ptr((shared_ptr<QPDFObjectHandle> *)&local_30);
  return local_1c;
}

Assistant:

static qpdf_oh
new_object(qpdf_data qpdf, QPDFObjectHandle const& qoh)
{
    qpdf_oh oh = ++qpdf->next_oh; // never return 0
    qpdf->oh_cache[oh] = std::make_shared<QPDFObjectHandle>(qoh);
    return oh;
}